

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ParseHex<unsigned_char>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string_view hex_str)

{
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *p_Var1;
  long in_FS_OFFSET;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_38;
  char local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  TryParseHex<unsigned_char>
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &local_38._M_value,hex_str);
  p_Var1 = (_Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> *)
           __return_storage_ptr__;
  if (local_20 == '\x01') {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_38._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_38._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_38._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    p_Var1 = &local_38;
  }
  (p_Var1->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (p_Var1->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (p_Var1->_M_value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_20 == '\x01') {
    local_20 = '\0';
    if (local_38._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38._M_value.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38._M_value.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage - local_38._0_8_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Byte> ParseHex(std::string_view hex_str)
{
    return TryParseHex<Byte>(hex_str).value_or(std::vector<Byte>{});
}